

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

uint __thiscall llvm::dwarf::getOperationEncoding(dwarf *this,StringRef OperationEncodingString)

{
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  
  pcVar5 = OperationEncodingString.Data;
  uVar4 = 0;
  bVar6 = false;
  if (pcVar5 == (char *)0xa) {
    bVar6 = *(short *)(this + 8) == 0x7264 && *(long *)this == 0x64615f504f5f5744;
    uVar4 = (uint)bVar6 * 3;
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x66657265645f504f && *(long *)this == 0x65645f504f5f5744) {
      uVar4 = 6;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x66657265645f504f || *(long *)this != 0x65645f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xd) && (!bVar2)) {
    if (*(long *)(this + 5) == 0x753174736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar4 = 8;
    }
    bVar6 = true;
    if (*(long *)(this + 5) != 0x753174736e6f635f || *(long *)this != 0x6f635f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xd) && (!bVar6)) {
    if (*(long *)(this + 5) == 0x733174736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar4 = 9;
    }
    bVar2 = true;
    if (*(long *)(this + 5) != 0x733174736e6f635f || *(long *)this != 0x6f635f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xd) && (!bVar2)) {
    if (*(long *)(this + 5) == 0x753274736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar4 = 10;
    }
    bVar6 = true;
    if (*(long *)(this + 5) != 0x753274736e6f635f || *(long *)this != 0x6f635f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xd) && (!bVar6)) {
    if (*(long *)(this + 5) == 0x733274736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar4 = 0xb;
    }
    bVar2 = true;
    if (*(long *)(this + 5) != 0x733274736e6f635f || *(long *)this != 0x6f635f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xd) && (!bVar2)) {
    if (*(long *)(this + 5) == 0x753474736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar4 = 0xc;
    }
    bVar6 = true;
    if (*(long *)(this + 5) != 0x753474736e6f635f || *(long *)this != 0x6f635f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xd) && (!bVar6)) {
    if (*(long *)(this + 5) == 0x733474736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar4 = 0xd;
    }
    bVar2 = true;
    if (*(long *)(this + 5) != 0x733474736e6f635f || *(long *)this != 0x6f635f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xd) && (!bVar2)) {
    if (*(long *)(this + 5) == 0x753874736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar4 = 0xe;
    }
    bVar6 = true;
    if (*(long *)(this + 5) != 0x753874736e6f635f || *(long *)this != 0x6f635f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xd) && (!bVar6)) {
    if (*(long *)(this + 5) == 0x733874736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar4 = 0xf;
    }
    bVar2 = true;
    if (*(long *)(this + 5) != 0x733874736e6f635f || *(long *)this != 0x6f635f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x7574736e && *(long *)this == 0x6f635f504f5f5744) {
      uVar4 = 0x10;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x7574736e || *(long *)this != 0x6f635f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xc) && (!bVar6)) {
    if (*(int *)(this + 8) == 0x7374736e && *(long *)this == 0x6f635f504f5f5744) {
      uVar4 = 0x11;
    }
    bVar2 = true;
    if (*(int *)(this + 8) != 0x7374736e || *(long *)this != 0x6f635f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == &DAT_00000009) && (!bVar2)) {
    if (this[8] == (dwarf)0x70 && *(long *)this == 0x75645f504f5f5744) {
      uVar4 = 0x12;
    }
    bVar6 = true;
    if (this[8] != (dwarf)0x70 || *(long *)this != 0x75645f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xa) && (!bVar6)) {
    if (*(short *)(this + 8) == 0x706f && *(long *)this == 0x72645f504f5f5744) {
      uVar4 = 0x13;
    }
    bVar2 = true;
    if (*(short *)(this + 8) != 0x706f || *(long *)this != 0x72645f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x7265 && *(long *)this == 0x766f5f504f5f5744) {
      uVar4 = 0x14;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x7265 || *(long *)this != 0x766f5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xa) && (!bVar6)) {
    if (*(short *)(this + 8) == 0x6b63 && *(long *)this == 0x69705f504f5f5744) {
      uVar4 = 0x15;
    }
    bVar2 = true;
    if (*(short *)(this + 8) != 0x6b63 || *(long *)this != 0x69705f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x7061 && *(long *)this == 0x77735f504f5f5744) {
      uVar4 = 0x16;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x7061 || *(long *)this != 0x77735f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == &DAT_00000009) && (!bVar6)) {
    if (this[8] == (dwarf)0x74 && *(long *)this == 0x6f725f504f5f5744) {
      uVar4 = 0x17;
    }
    bVar2 = true;
    if (this[8] != (dwarf)0x74 || *(long *)this != 0x6f725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x66657265 && *(long *)this == 0x64785f504f5f5744) {
      uVar4 = 0x18;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x66657265 || *(long *)this != 0x64785f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == &DAT_00000009) && (!bVar6)) {
    if (this[8] == (dwarf)0x73 && *(long *)this == 0x62615f504f5f5744) {
      uVar4 = 0x19;
    }
    bVar2 = true;
    if (this[8] != (dwarf)0x73 || *(long *)this != 0x62615f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == &DAT_00000009) && (!bVar2)) {
    if (this[8] == (dwarf)0x64 && *(long *)this == 0x6e615f504f5f5744) {
      uVar4 = 0x1a;
    }
    bVar6 = true;
    if (this[8] != (dwarf)0x64 || *(long *)this != 0x6e615f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == &DAT_00000009) && (!bVar6)) {
    if (this[8] == (dwarf)0x76 && *(long *)this == 0x69645f504f5f5744) {
      uVar4 = 0x1b;
    }
    bVar2 = true;
    if (this[8] != (dwarf)0x76 || *(long *)this != 0x69645f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x73756e696d5f504f && *(long *)this == 0x696d5f504f5f5744) {
      uVar4 = 0x1c;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x73756e696d5f504f || *(long *)this != 0x696d5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == &DAT_00000009) && (!bVar6)) {
    if (this[8] == (dwarf)0x64 && *(long *)this == 0x6f6d5f504f5f5744) {
      uVar4 = 0x1d;
    }
    bVar2 = true;
    if (this[8] != (dwarf)0x64 || *(long *)this != 0x6f6d5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == &DAT_00000009) && (!bVar2)) {
    if (this[8] == (dwarf)0x6c && *(long *)this == 0x756d5f504f5f5744) {
      uVar4 = 0x1e;
    }
    bVar6 = true;
    if (this[8] != (dwarf)0x6c || *(long *)this != 0x756d5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == &DAT_00000009) && (!bVar6)) {
    if (this[8] == (dwarf)0x67 && *(long *)this == 0x656e5f504f5f5744) {
      uVar4 = 0x1f;
    }
    bVar2 = true;
    if (this[8] != (dwarf)0x67 || *(long *)this != 0x656e5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == &DAT_00000009) && (!bVar2)) {
    if (this[8] == (dwarf)0x74 && *(long *)this == 0x6f6e5f504f5f5744) {
      uVar4 = 0x20;
    }
    bVar6 = true;
    if (this[8] != (dwarf)0x74 || *(long *)this != 0x6f6e5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == &DAT_00000008) && (!bVar6)) {
    if (*(long *)this == 0x726f5f504f5f5744) {
      uVar4 = 0x21;
    }
    bVar2 = true;
    if (*(long *)this != 0x726f5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x7375 && *(long *)this == 0x6c705f504f5f5744) {
      uVar4 = 0x22;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x7375 || *(long *)this != 0x6c705f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0x11) && (!bVar6)) {
    auVar8[0] = -(*this == (dwarf)'D');
    auVar8[1] = -(this[1] == (dwarf)'W');
    auVar8[2] = -(this[2] == (dwarf)'_');
    auVar8[3] = -(this[3] == (dwarf)'O');
    auVar8[4] = -(this[4] == (dwarf)'P');
    auVar8[5] = -(this[5] == (dwarf)'_');
    auVar8[6] = -(this[6] == (dwarf)'p');
    auVar8[7] = -(this[7] == (dwarf)'l');
    auVar8[8] = -(this[8] == (dwarf)'u');
    auVar8[9] = -(this[9] == (dwarf)'s');
    auVar8[10] = -(this[10] == (dwarf)'_');
    auVar8[0xb] = -(this[0xb] == (dwarf)'u');
    auVar8[0xc] = -(this[0xc] == (dwarf)'c');
    auVar8[0xd] = -(this[0xd] == (dwarf)'o');
    auVar8[0xe] = -(this[0xe] == (dwarf)'n');
    auVar8[0xf] = -(this[0xf] == (dwarf)'s');
    auVar32[0] = -(this[0x10] == (dwarf)'t');
    auVar32[1] = 0xff;
    auVar32[2] = 0xff;
    auVar32[3] = 0xff;
    auVar32[4] = 0xff;
    auVar32[5] = 0xff;
    auVar32[6] = 0xff;
    auVar32[7] = 0xff;
    auVar32[8] = 0xff;
    auVar32[9] = 0xff;
    auVar32[10] = 0xff;
    auVar32[0xb] = 0xff;
    auVar32[0xc] = 0xff;
    auVar32[0xd] = 0xff;
    auVar32[0xe] = 0xff;
    auVar32[0xf] = 0xff;
    auVar32 = auVar32 & auVar8;
    bVar7 = (ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0x23;
    }
    bVar2 = true;
    if (!bVar7) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == &DAT_00000009) && (!bVar2)) {
    if (this[8] == (dwarf)0x6c && *(long *)this == 0x68735f504f5f5744) {
      uVar4 = 0x24;
    }
    bVar6 = true;
    if (this[8] != (dwarf)0x6c || *(long *)this != 0x68735f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == &DAT_00000009) && (!bVar6)) {
    if (this[8] == (dwarf)0x72 && *(long *)this == 0x68735f504f5f5744) {
      uVar4 = 0x25;
    }
    bVar2 = true;
    if (this[8] != (dwarf)0x72 || *(long *)this != 0x68735f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x6172 && *(long *)this == 0x68735f504f5f5744) {
      uVar4 = 0x26;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x6172 || *(long *)this != 0x68735f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == &DAT_00000009) && (!bVar6)) {
    if (this[8] == (dwarf)0x72 && *(long *)this == 0x6f785f504f5f5744) {
      uVar4 = 0x27;
    }
    bVar2 = true;
    if (this[8] != (dwarf)0x72 || *(long *)this != 0x6f785f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == &DAT_00000009) && (!bVar2)) {
    if (this[8] == (dwarf)0x61 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x28;
    }
    bVar6 = true;
    if (this[8] != (dwarf)0x61 || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == &DAT_00000008) && (!bVar6)) {
    if (*(long *)this == 0x71655f504f5f5744) {
      uVar4 = 0x29;
    }
    bVar2 = true;
    if (*(long *)this != 0x71655f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == &DAT_00000008) && (!bVar2)) {
    if (*(long *)this == 0x65675f504f5f5744) {
      uVar4 = 0x2a;
    }
    bVar6 = true;
    if (*(long *)this != 0x65675f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == &DAT_00000008) && (!bVar6)) {
    if (*(long *)this == 0x74675f504f5f5744) {
      uVar4 = 0x2b;
    }
    bVar2 = true;
    if (*(long *)this != 0x74675f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == &DAT_00000008) && (!bVar2)) {
    if (*(long *)this == 0x656c5f504f5f5744) {
      uVar4 = 0x2c;
    }
    bVar6 = true;
    if (*(long *)this != 0x656c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == &DAT_00000008) && (!bVar6)) {
    if (*(long *)this == 0x746c5f504f5f5744) {
      uVar4 = 0x2d;
    }
    bVar2 = true;
    if (*(long *)this != 0x746c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == &DAT_00000008) && (!bVar2)) {
    if (*(long *)this == 0x656e5f504f5f5744) {
      uVar4 = 0x2e;
    }
    bVar6 = true;
    if (*(long *)this != 0x656e5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xa) && (!bVar6)) {
    if (*(short *)(this + 8) == 0x7069 && *(long *)this == 0x6b735f504f5f5744) {
      uVar4 = 0x2f;
    }
    bVar2 = true;
    if (*(short *)(this + 8) != 0x7069 || *(long *)this != 0x6b735f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x3074 && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x30;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x3074 || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xa) && (!bVar6)) {
    if (*(short *)(this + 8) == 0x3174 && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x31;
    }
    bVar2 = true;
    if (*(short *)(this + 8) != 0x3174 || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x3274 && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x32;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x3274 || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xa) && (!bVar6)) {
    if (*(short *)(this + 8) == 0x3374 && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x33;
    }
    bVar2 = true;
    if (*(short *)(this + 8) != 0x3374 || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x3474 && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x34;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x3474 || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xa) && (!bVar6)) {
    if (*(short *)(this + 8) == 0x3574 && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x35;
    }
    bVar2 = true;
    if (*(short *)(this + 8) != 0x3574 || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x3674 && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x36;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x3674 || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xa) && (!bVar6)) {
    if (*(short *)(this + 8) == 0x3774 && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x37;
    }
    bVar2 = true;
    if (*(short *)(this + 8) != 0x3774 || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x3874 && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x38;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x3874 || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xa) && (!bVar6)) {
    if (*(short *)(this + 8) == 0x3974 && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x39;
    }
    bVar2 = true;
    if (*(short *)(this + 8) != 0x3974 || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x303174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x3a;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x303174696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x313174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x3b;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x313174696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x323174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x3c;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x323174696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x333174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x3d;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x333174696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x343174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x3e;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x343174696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x353174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x3f;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x353174696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x363174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x40;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x363174696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x373174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x41;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x373174696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x383174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x42;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x383174696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x393174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x43;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x393174696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x303274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x44;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x303274696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x313274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x45;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x313274696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x323274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x46;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x323274696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x333274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x47;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x333274696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x343274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x48;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x343274696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x353274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x49;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x353274696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x363274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x4a;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x363274696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x373274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x4b;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x373274696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x383274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x4c;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x383274696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x393274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x4d;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x393274696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x303374696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x4e;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x303374696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x313374696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar4 = 0x4f;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x313374696c5f504f || *(long *)this != 0x696c5f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x3067 && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x50;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x3067 || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xa) && (!bVar6)) {
    if (*(short *)(this + 8) == 0x3167 && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x51;
    }
    bVar2 = true;
    if (*(short *)(this + 8) != 0x3167 || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x3267 && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x52;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x3267 || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xa) && (!bVar6)) {
    if (*(short *)(this + 8) == 0x3367 && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x53;
    }
    bVar2 = true;
    if (*(short *)(this + 8) != 0x3367 || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x3467 && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x54;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x3467 || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xa) && (!bVar6)) {
    if (*(short *)(this + 8) == 0x3567 && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x55;
    }
    bVar2 = true;
    if (*(short *)(this + 8) != 0x3567 || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x3667 && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x56;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x3667 || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xa) && (!bVar6)) {
    if (*(short *)(this + 8) == 0x3767 && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x57;
    }
    bVar2 = true;
    if (*(short *)(this + 8) != 0x3767 || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x3867 && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x58;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x3867 || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xa) && (!bVar6)) {
    if (*(short *)(this + 8) == 0x3967 && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x59;
    }
    bVar2 = true;
    if (*(short *)(this + 8) != 0x3967 || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x30316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x5a;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x30316765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x31316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x5b;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x31316765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x32316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x5c;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x32316765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x33316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x5d;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x33316765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x34316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x5e;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x34316765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x35316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x5f;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x35316765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x36316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x60;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x36316765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x37316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x61;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x37316765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x38316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x62;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x38316765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x39316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 99;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x39316765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x30326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 100;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x30326765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x31326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x65;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x31326765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x32326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x66;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x32326765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x33326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x67;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x33326765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x34326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x68;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x34326765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x35326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x69;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x35326765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x36326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x6a;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x36326765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x37326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x6b;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x37326765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x38326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x6c;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x38326765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x39326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x6d;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x39326765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x30336765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x6e;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x30336765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x31336765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x6f;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x31336765725f504f || *(long *)this != 0x65725f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x30676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x70;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x30676572625f504f || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x31676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x71;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x31676572625f504f || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x32676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x72;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x32676572625f504f || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x33676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x73;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x33676572625f504f || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x34676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x74;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x34676572625f504f || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x35676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x75;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x35676572625f504f || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x36676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x76;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x36676572625f504f || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x37676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x77;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x37676572625f504f || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x38676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x78;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x38676572625f504f || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x39676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x79;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x39676572625f504f || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x30316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x7a;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x30316765 || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xc) && (!bVar6)) {
    if (*(int *)(this + 8) == 0x31316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x7b;
    }
    bVar2 = true;
    if (*(int *)(this + 8) != 0x31316765 || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x32316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x7c;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x32316765 || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xc) && (!bVar6)) {
    if (*(int *)(this + 8) == 0x33316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x7d;
    }
    bVar2 = true;
    if (*(int *)(this + 8) != 0x33316765 || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x34316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x7e;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x34316765 || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xc) && (!bVar6)) {
    if (*(int *)(this + 8) == 0x35316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x7f;
    }
    bVar2 = true;
    if (*(int *)(this + 8) != 0x35316765 || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x36316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x80;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x36316765 || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xc) && (!bVar6)) {
    if (*(int *)(this + 8) == 0x37316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x81;
    }
    bVar2 = true;
    if (*(int *)(this + 8) != 0x37316765 || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x38316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x82;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x38316765 || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xc) && (!bVar6)) {
    if (*(int *)(this + 8) == 0x39316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x83;
    }
    bVar2 = true;
    if (*(int *)(this + 8) != 0x39316765 || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x30326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x84;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x30326765 || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xc) && (!bVar6)) {
    if (*(int *)(this + 8) == 0x31326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x85;
    }
    bVar2 = true;
    if (*(int *)(this + 8) != 0x31326765 || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x32326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x86;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x32326765 || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xc) && (!bVar6)) {
    if (*(int *)(this + 8) == 0x33326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x87;
    }
    bVar2 = true;
    if (*(int *)(this + 8) != 0x33326765 || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x34326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x88;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x34326765 || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xc) && (!bVar6)) {
    if (*(int *)(this + 8) == 0x35326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x89;
    }
    bVar2 = true;
    if (*(int *)(this + 8) != 0x35326765 || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x36326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x8a;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x36326765 || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xc) && (!bVar6)) {
    if (*(int *)(this + 8) == 0x37326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x8b;
    }
    bVar2 = true;
    if (*(int *)(this + 8) != 0x37326765 || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x38326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x8c;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x38326765 || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xc) && (!bVar6)) {
    if (*(int *)(this + 8) == 0x39326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x8d;
    }
    bVar2 = true;
    if (*(int *)(this + 8) != 0x39326765 || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x30336765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x8e;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x30336765 || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xc) && (!bVar6)) {
    if (*(int *)(this + 8) == 0x31336765 && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x8f;
    }
    bVar2 = true;
    if (*(int *)(this + 8) != 0x31336765 || *(long *)this != 0x72625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xa) && (!bVar2)) {
    if (*(short *)(this + 8) == 0x7867 && *(long *)this == 0x65725f504f5f5744) {
      uVar4 = 0x90;
    }
    bVar6 = true;
    if (*(short *)(this + 8) != 0x7867 || *(long *)this != 0x65725f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x67657262665f504f && *(long *)this == 0x62665f504f5f5744) {
      uVar4 = 0x91;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x67657262665f504f || *(long *)this != 0x62665f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x78676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar4 = 0x92;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x78676572625f504f || *(long *)this != 0x72625f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x65636569705f504f && *(long *)this == 0x69705f504f5f5744) {
      uVar4 = 0x93;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x65636569705f504f || *(long *)this != 0x69705f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0x10) && (!bVar2)) {
    auVar9[0] = -(*this == (dwarf)'D');
    auVar9[1] = -(this[1] == (dwarf)'W');
    auVar9[2] = -(this[2] == (dwarf)'_');
    auVar9[3] = -(this[3] == (dwarf)'O');
    auVar9[4] = -(this[4] == (dwarf)'P');
    auVar9[5] = -(this[5] == (dwarf)'_');
    auVar9[6] = -(this[6] == (dwarf)'d');
    auVar9[7] = -(this[7] == (dwarf)'e');
    auVar9[8] = -(this[8] == (dwarf)'r');
    auVar9[9] = -(this[9] == (dwarf)'e');
    auVar9[10] = -(this[10] == (dwarf)'f');
    auVar9[0xb] = -(this[0xb] == (dwarf)'_');
    auVar9[0xc] = -(this[0xc] == (dwarf)'s');
    auVar9[0xd] = -(this[0xd] == (dwarf)'i');
    auVar9[0xe] = -(this[0xe] == (dwarf)'z');
    auVar9[0xf] = -(this[0xf] == (dwarf)'e');
    bVar7 = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar9[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0x94;
    }
    bVar6 = true;
    if (!bVar7) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0x11) && (!bVar6)) {
    auVar10[0] = -(*this == (dwarf)'D');
    auVar10[1] = -(this[1] == (dwarf)'W');
    auVar10[2] = -(this[2] == (dwarf)'_');
    auVar10[3] = -(this[3] == (dwarf)'O');
    auVar10[4] = -(this[4] == (dwarf)'P');
    auVar10[5] = -(this[5] == (dwarf)'_');
    auVar10[6] = -(this[6] == (dwarf)'x');
    auVar10[7] = -(this[7] == (dwarf)'d');
    auVar10[8] = -(this[8] == (dwarf)'e');
    auVar10[9] = -(this[9] == (dwarf)'r');
    auVar10[10] = -(this[10] == (dwarf)'e');
    auVar10[0xb] = -(this[0xb] == (dwarf)'f');
    auVar10[0xc] = -(this[0xc] == (dwarf)'_');
    auVar10[0xd] = -(this[0xd] == (dwarf)'s');
    auVar10[0xe] = -(this[0xe] == (dwarf)'i');
    auVar10[0xf] = -(this[0xf] == (dwarf)'z');
    auVar33[0] = -(this[0x10] == (dwarf)'e');
    auVar33[1] = 0xff;
    auVar33[2] = 0xff;
    auVar33[3] = 0xff;
    auVar33[4] = 0xff;
    auVar33[5] = 0xff;
    auVar33[6] = 0xff;
    auVar33[7] = 0xff;
    auVar33[8] = 0xff;
    auVar33[9] = 0xff;
    auVar33[10] = 0xff;
    auVar33[0xb] = 0xff;
    auVar33[0xc] = 0xff;
    auVar33[0xd] = 0xff;
    auVar33[0xe] = 0xff;
    auVar33[0xf] = 0xff;
    auVar33 = auVar33 & auVar10;
    bVar7 = (ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0x95;
    }
    bVar2 = true;
    if (!bVar7) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == &DAT_00000009) && (!bVar2)) {
    if (this[8] == (dwarf)0x70 && *(long *)this == 0x6f6e5f504f5f5744) {
      uVar4 = 0x96;
    }
    bVar6 = true;
    if (this[8] != (dwarf)0x70 || *(long *)this != 0x6f6e5f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == &DAT_00000019) && (!bVar6)) {
    auVar34[0] = -(this[9] == (dwarf)'h');
    auVar34[1] = -(this[10] == (dwarf)'_');
    auVar34[2] = -(this[0xb] == (dwarf)'o');
    auVar34[3] = -(this[0xc] == (dwarf)'b');
    auVar34[4] = -(this[0xd] == (dwarf)'j');
    auVar34[5] = -(this[0xe] == (dwarf)'e');
    auVar34[6] = -(this[0xf] == (dwarf)'c');
    auVar34[7] = -(this[0x10] == (dwarf)'t');
    auVar34[8] = -(this[0x11] == (dwarf)'_');
    auVar34[9] = -(this[0x12] == (dwarf)'a');
    auVar34[10] = -(this[0x13] == (dwarf)'d');
    auVar34[0xb] = -(this[0x14] == (dwarf)'d');
    auVar34[0xc] = -(this[0x15] == (dwarf)'r');
    auVar34[0xd] = -(this[0x16] == (dwarf)'e');
    auVar34[0xe] = -(this[0x17] == (dwarf)'s');
    auVar34[0xf] = -(this[0x18] == (dwarf)'s');
    auVar11[0] = -(*this == (dwarf)'D');
    auVar11[1] = -(this[1] == (dwarf)'W');
    auVar11[2] = -(this[2] == (dwarf)'_');
    auVar11[3] = -(this[3] == (dwarf)'O');
    auVar11[4] = -(this[4] == (dwarf)'P');
    auVar11[5] = -(this[5] == (dwarf)'_');
    auVar11[6] = -(this[6] == (dwarf)'p');
    auVar11[7] = -(this[7] == (dwarf)'u');
    auVar11[8] = -(this[8] == (dwarf)'s');
    auVar11[9] = -(this[9] == (dwarf)'h');
    auVar11[10] = -(this[10] == (dwarf)'_');
    auVar11[0xb] = -(this[0xb] == (dwarf)'o');
    auVar11[0xc] = -(this[0xc] == (dwarf)'b');
    auVar11[0xd] = -(this[0xd] == (dwarf)'j');
    auVar11[0xe] = -(this[0xe] == (dwarf)'e');
    auVar11[0xf] = -(this[0xf] == (dwarf)'c');
    auVar11 = auVar11 & auVar34;
    bVar7 = (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0x97;
    }
    bVar2 = true;
    if (!bVar7) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xb) && (!bVar2)) {
    if (*(long *)(this + 3) == 0x326c6c61635f504f && *(long *)this == 0x61635f504f5f5744) {
      uVar4 = 0x98;
    }
    bVar6 = true;
    if (*(long *)(this + 3) != 0x326c6c61635f504f || *(long *)this != 0x61635f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x346c6c61635f504f && *(long *)this == 0x61635f504f5f5744) {
      uVar4 = 0x99;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x346c6c61635f504f || *(long *)this != 0x61635f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xe) && (!bVar2)) {
    if (*(long *)(this + 6) == 0x6665725f6c6c6163 && *(long *)this == 0x61635f504f5f5744) {
      uVar4 = 0x9a;
    }
    bVar6 = true;
    if (*(long *)(this + 6) != 0x6665725f6c6c6163 || *(long *)this != 0x61635f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0x16) && (!bVar6)) {
    auVar35[0] = -(this[6] == (dwarf)'f');
    auVar35[1] = -(this[7] == (dwarf)'o');
    auVar35[2] = -(this[8] == (dwarf)'r');
    auVar35[3] = -(this[9] == (dwarf)'m');
    auVar35[4] = -(this[10] == (dwarf)'_');
    auVar35[5] = -(this[0xb] == (dwarf)'t');
    auVar35[6] = -(this[0xc] == (dwarf)'l');
    auVar35[7] = -(this[0xd] == (dwarf)'s');
    auVar35[8] = -(this[0xe] == (dwarf)'_');
    auVar35[9] = -(this[0xf] == (dwarf)'a');
    auVar35[10] = -(this[0x10] == (dwarf)'d');
    auVar35[0xb] = -(this[0x11] == (dwarf)'d');
    auVar35[0xc] = -(this[0x12] == (dwarf)'r');
    auVar35[0xd] = -(this[0x13] == (dwarf)'e');
    auVar35[0xe] = -(this[0x14] == (dwarf)'s');
    auVar35[0xf] = -(this[0x15] == (dwarf)'s');
    auVar12[0] = -(*this == (dwarf)'D');
    auVar12[1] = -(this[1] == (dwarf)'W');
    auVar12[2] = -(this[2] == (dwarf)'_');
    auVar12[3] = -(this[3] == (dwarf)'O');
    auVar12[4] = -(this[4] == (dwarf)'P');
    auVar12[5] = -(this[5] == (dwarf)'_');
    auVar12[6] = -(this[6] == (dwarf)'f');
    auVar12[7] = -(this[7] == (dwarf)'o');
    auVar12[8] = -(this[8] == (dwarf)'r');
    auVar12[9] = -(this[9] == (dwarf)'m');
    auVar12[10] = -(this[10] == (dwarf)'_');
    auVar12[0xb] = -(this[0xb] == (dwarf)'t');
    auVar12[0xc] = -(this[0xc] == (dwarf)'l');
    auVar12[0xd] = -(this[0xd] == (dwarf)'s');
    auVar12[0xe] = -(this[0xe] == (dwarf)'_');
    auVar12[0xf] = -(this[0xf] == (dwarf)'a');
    auVar12 = auVar12 & auVar35;
    bVar7 = (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0x9b;
    }
    bVar2 = true;
    if (!bVar7) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0x14) && (!bVar2)) {
    uVar1 = *(undefined4 *)(this + 0x10);
    auVar36[0] = -((char)uVar1 == '_');
    auVar36[1] = -((char)((uint)uVar1 >> 8) == 'c');
    auVar36[2] = -((char)((uint)uVar1 >> 0x10) == 'f');
    auVar36[3] = -((char)((uint)uVar1 >> 0x18) == 'a');
    auVar36[4] = 0xff;
    auVar36[5] = 0xff;
    auVar36[6] = 0xff;
    auVar36[7] = 0xff;
    auVar36[8] = 0xff;
    auVar36[9] = 0xff;
    auVar36[10] = 0xff;
    auVar36[0xb] = 0xff;
    auVar36[0xc] = 0xff;
    auVar36[0xd] = 0xff;
    auVar36[0xe] = 0xff;
    auVar36[0xf] = 0xff;
    auVar13[0] = -(*this == (dwarf)'D');
    auVar13[1] = -(this[1] == (dwarf)'W');
    auVar13[2] = -(this[2] == (dwarf)'_');
    auVar13[3] = -(this[3] == (dwarf)'O');
    auVar13[4] = -(this[4] == (dwarf)'P');
    auVar13[5] = -(this[5] == (dwarf)'_');
    auVar13[6] = -(this[6] == (dwarf)'c');
    auVar13[7] = -(this[7] == (dwarf)'a');
    auVar13[8] = -(this[8] == (dwarf)'l');
    auVar13[9] = -(this[9] == (dwarf)'l');
    auVar13[10] = -(this[10] == (dwarf)'_');
    auVar13[0xb] = -(this[0xb] == (dwarf)'f');
    auVar13[0xc] = -(this[0xc] == (dwarf)'r');
    auVar13[0xd] = -(this[0xd] == (dwarf)'a');
    auVar13[0xe] = -(this[0xe] == (dwarf)'m');
    auVar13[0xf] = -(this[0xf] == (dwarf)'e');
    auVar13 = auVar13 & auVar36;
    bVar7 = (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0x9c;
    }
    bVar6 = true;
    if (!bVar7) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xf) && (!bVar6)) {
    if (*(long *)(this + 7) == 0x65636569705f7469 && *(long *)this == 0x69625f504f5f5744) {
      uVar4 = 0x9d;
    }
    bVar2 = true;
    if (*(long *)(this + 7) != 0x65636569705f7469 || *(long *)this != 0x69625f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0x14) && (!bVar2)) {
    uVar1 = *(undefined4 *)(this + 0x10);
    auVar37[0] = -((char)uVar1 == 'a');
    auVar37[1] = -((char)((uint)uVar1 >> 8) == 'l');
    auVar37[2] = -((char)((uint)uVar1 >> 0x10) == 'u');
    auVar37[3] = -((char)((uint)uVar1 >> 0x18) == 'e');
    auVar37[4] = 0xff;
    auVar37[5] = 0xff;
    auVar37[6] = 0xff;
    auVar37[7] = 0xff;
    auVar37[8] = 0xff;
    auVar37[9] = 0xff;
    auVar37[10] = 0xff;
    auVar37[0xb] = 0xff;
    auVar37[0xc] = 0xff;
    auVar37[0xd] = 0xff;
    auVar37[0xe] = 0xff;
    auVar37[0xf] = 0xff;
    auVar14[0] = -(*this == (dwarf)'D');
    auVar14[1] = -(this[1] == (dwarf)'W');
    auVar14[2] = -(this[2] == (dwarf)'_');
    auVar14[3] = -(this[3] == (dwarf)'O');
    auVar14[4] = -(this[4] == (dwarf)'P');
    auVar14[5] = -(this[5] == (dwarf)'_');
    auVar14[6] = -(this[6] == (dwarf)'i');
    auVar14[7] = -(this[7] == (dwarf)'m');
    auVar14[8] = -(this[8] == (dwarf)'p');
    auVar14[9] = -(this[9] == (dwarf)'l');
    auVar14[10] = -(this[10] == (dwarf)'i');
    auVar14[0xb] = -(this[0xb] == (dwarf)'c');
    auVar14[0xc] = -(this[0xc] == (dwarf)'i');
    auVar14[0xd] = -(this[0xd] == (dwarf)'t');
    auVar14[0xe] = -(this[0xe] == (dwarf)'_');
    auVar14[0xf] = -(this[0xf] == (dwarf)'v');
    auVar14 = auVar14 & auVar37;
    bVar7 = (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0x9e;
    }
    bVar6 = true;
    if (!bVar7) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0x11) && (!bVar6)) {
    auVar15[0] = -(*this == (dwarf)'D');
    auVar15[1] = -(this[1] == (dwarf)'W');
    auVar15[2] = -(this[2] == (dwarf)'_');
    auVar15[3] = -(this[3] == (dwarf)'O');
    auVar15[4] = -(this[4] == (dwarf)'P');
    auVar15[5] = -(this[5] == (dwarf)'_');
    auVar15[6] = -(this[6] == (dwarf)'s');
    auVar15[7] = -(this[7] == (dwarf)'t');
    auVar15[8] = -(this[8] == (dwarf)'a');
    auVar15[9] = -(this[9] == (dwarf)'c');
    auVar15[10] = -(this[10] == (dwarf)'k');
    auVar15[0xb] = -(this[0xb] == (dwarf)'_');
    auVar15[0xc] = -(this[0xc] == (dwarf)'v');
    auVar15[0xd] = -(this[0xd] == (dwarf)'a');
    auVar15[0xe] = -(this[0xe] == (dwarf)'l');
    auVar15[0xf] = -(this[0xf] == (dwarf)'u');
    auVar38[0] = -(this[0x10] == (dwarf)'e');
    auVar38[1] = 0xff;
    auVar38[2] = 0xff;
    auVar38[3] = 0xff;
    auVar38[4] = 0xff;
    auVar38[5] = 0xff;
    auVar38[6] = 0xff;
    auVar38[7] = 0xff;
    auVar38[8] = 0xff;
    auVar38[9] = 0xff;
    auVar38[10] = 0xff;
    auVar38[0xb] = 0xff;
    auVar38[0xc] = 0xff;
    auVar38[0xd] = 0xff;
    auVar38[0xe] = 0xff;
    auVar38[0xf] = 0xff;
    auVar38 = auVar38 & auVar15;
    bVar7 = (ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar38[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0x9f;
    }
    bVar2 = true;
    if (!bVar7) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0x16) && (!bVar2)) {
    auVar39[0] = -(this[6] == (dwarf)'i');
    auVar39[1] = -(this[7] == (dwarf)'m');
    auVar39[2] = -(this[8] == (dwarf)'p');
    auVar39[3] = -(this[9] == (dwarf)'l');
    auVar39[4] = -(this[10] == (dwarf)'i');
    auVar39[5] = -(this[0xb] == (dwarf)'c');
    auVar39[6] = -(this[0xc] == (dwarf)'i');
    auVar39[7] = -(this[0xd] == (dwarf)'t');
    auVar39[8] = -(this[0xe] == (dwarf)'_');
    auVar39[9] = -(this[0xf] == (dwarf)'p');
    auVar39[10] = -(this[0x10] == (dwarf)'o');
    auVar39[0xb] = -(this[0x11] == (dwarf)'i');
    auVar39[0xc] = -(this[0x12] == (dwarf)'n');
    auVar39[0xd] = -(this[0x13] == (dwarf)'t');
    auVar39[0xe] = -(this[0x14] == (dwarf)'e');
    auVar39[0xf] = -(this[0x15] == (dwarf)'r');
    auVar16[0] = -(*this == (dwarf)'D');
    auVar16[1] = -(this[1] == (dwarf)'W');
    auVar16[2] = -(this[2] == (dwarf)'_');
    auVar16[3] = -(this[3] == (dwarf)'O');
    auVar16[4] = -(this[4] == (dwarf)'P');
    auVar16[5] = -(this[5] == (dwarf)'_');
    auVar16[6] = -(this[6] == (dwarf)'i');
    auVar16[7] = -(this[7] == (dwarf)'m');
    auVar16[8] = -(this[8] == (dwarf)'p');
    auVar16[9] = -(this[9] == (dwarf)'l');
    auVar16[10] = -(this[10] == (dwarf)'i');
    auVar16[0xb] = -(this[0xb] == (dwarf)'c');
    auVar16[0xc] = -(this[0xc] == (dwarf)'i');
    auVar16[0xd] = -(this[0xd] == (dwarf)'t');
    auVar16[0xe] = -(this[0xe] == (dwarf)'_');
    auVar16[0xf] = -(this[0xf] == (dwarf)'p');
    auVar16 = auVar16 & auVar39;
    bVar7 = (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0xa0;
    }
    bVar6 = true;
    if (!bVar7) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0xb) && (!bVar6)) {
    if (*(long *)(this + 3) == 0x78726464615f504f && *(long *)this == 0x64615f504f5f5744) {
      uVar4 = 0xa1;
    }
    bVar2 = true;
    if (*(long *)(this + 3) != 0x78726464615f504f || *(long *)this != 0x64615f504f5f5744) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xc) && (!bVar2)) {
    if (*(int *)(this + 8) == 0x7874736e && *(long *)this == 0x6f635f504f5f5744) {
      uVar4 = 0xa2;
    }
    bVar6 = true;
    if (*(int *)(this + 8) != 0x7874736e || *(long *)this != 0x6f635f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0x11) && (!bVar6)) {
    auVar17[0] = -(*this == (dwarf)'D');
    auVar17[1] = -(this[1] == (dwarf)'W');
    auVar17[2] = -(this[2] == (dwarf)'_');
    auVar17[3] = -(this[3] == (dwarf)'O');
    auVar17[4] = -(this[4] == (dwarf)'P');
    auVar17[5] = -(this[5] == (dwarf)'_');
    auVar17[6] = -(this[6] == (dwarf)'e');
    auVar17[7] = -(this[7] == (dwarf)'n');
    auVar17[8] = -(this[8] == (dwarf)'t');
    auVar17[9] = -(this[9] == (dwarf)'r');
    auVar17[10] = -(this[10] == (dwarf)'y');
    auVar17[0xb] = -(this[0xb] == (dwarf)'_');
    auVar17[0xc] = -(this[0xc] == (dwarf)'v');
    auVar17[0xd] = -(this[0xd] == (dwarf)'a');
    auVar17[0xe] = -(this[0xe] == (dwarf)'l');
    auVar17[0xf] = -(this[0xf] == (dwarf)'u');
    auVar40[0] = -(this[0x10] == (dwarf)'e');
    auVar40[1] = 0xff;
    auVar40[2] = 0xff;
    auVar40[3] = 0xff;
    auVar40[4] = 0xff;
    auVar40[5] = 0xff;
    auVar40[6] = 0xff;
    auVar40[7] = 0xff;
    auVar40[8] = 0xff;
    auVar40[9] = 0xff;
    auVar40[10] = 0xff;
    auVar40[0xb] = 0xff;
    auVar40[0xc] = 0xff;
    auVar40[0xd] = 0xff;
    auVar40[0xe] = 0xff;
    auVar40[0xf] = 0xff;
    auVar40 = auVar40 & auVar17;
    bVar7 = (ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar40[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0xa3;
    }
    bVar2 = true;
    if (!bVar7) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0x10) && (!bVar2)) {
    auVar18[0] = -(*this == (dwarf)'D');
    auVar18[1] = -(this[1] == (dwarf)'W');
    auVar18[2] = -(this[2] == (dwarf)'_');
    auVar18[3] = -(this[3] == (dwarf)'O');
    auVar18[4] = -(this[4] == (dwarf)'P');
    auVar18[5] = -(this[5] == (dwarf)'_');
    auVar18[6] = -(this[6] == (dwarf)'c');
    auVar18[7] = -(this[7] == (dwarf)'o');
    auVar18[8] = -(this[8] == (dwarf)'n');
    auVar18[9] = -(this[9] == (dwarf)'s');
    auVar18[10] = -(this[10] == (dwarf)'t');
    auVar18[0xb] = -(this[0xb] == (dwarf)'_');
    auVar18[0xc] = -(this[0xc] == (dwarf)'t');
    auVar18[0xd] = -(this[0xd] == (dwarf)'y');
    auVar18[0xe] = -(this[0xe] == (dwarf)'p');
    auVar18[0xf] = -(this[0xf] == (dwarf)'e');
    bVar7 = (ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar18[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0xa4;
    }
    bVar6 = true;
    if (!bVar7) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0x11) && (!bVar6)) {
    auVar19[0] = -(*this == (dwarf)'D');
    auVar19[1] = -(this[1] == (dwarf)'W');
    auVar19[2] = -(this[2] == (dwarf)'_');
    auVar19[3] = -(this[3] == (dwarf)'O');
    auVar19[4] = -(this[4] == (dwarf)'P');
    auVar19[5] = -(this[5] == (dwarf)'_');
    auVar19[6] = -(this[6] == (dwarf)'r');
    auVar19[7] = -(this[7] == (dwarf)'e');
    auVar19[8] = -(this[8] == (dwarf)'g');
    auVar19[9] = -(this[9] == (dwarf)'v');
    auVar19[10] = -(this[10] == (dwarf)'a');
    auVar19[0xb] = -(this[0xb] == (dwarf)'l');
    auVar19[0xc] = -(this[0xc] == (dwarf)'_');
    auVar19[0xd] = -(this[0xd] == (dwarf)'t');
    auVar19[0xe] = -(this[0xe] == (dwarf)'y');
    auVar19[0xf] = -(this[0xf] == (dwarf)'p');
    auVar41[0] = -(this[0x10] == (dwarf)'e');
    auVar41[1] = 0xff;
    auVar41[2] = 0xff;
    auVar41[3] = 0xff;
    auVar41[4] = 0xff;
    auVar41[5] = 0xff;
    auVar41[6] = 0xff;
    auVar41[7] = 0xff;
    auVar41[8] = 0xff;
    auVar41[9] = 0xff;
    auVar41[10] = 0xff;
    auVar41[0xb] = 0xff;
    auVar41[0xc] = 0xff;
    auVar41[0xd] = 0xff;
    auVar41[0xe] = 0xff;
    auVar41[0xf] = 0xff;
    auVar41 = auVar41 & auVar19;
    bVar7 = (ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0xa5;
    }
    bVar2 = true;
    if (!bVar7) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0x10) && (!bVar2)) {
    auVar20[0] = -(*this == (dwarf)'D');
    auVar20[1] = -(this[1] == (dwarf)'W');
    auVar20[2] = -(this[2] == (dwarf)'_');
    auVar20[3] = -(this[3] == (dwarf)'O');
    auVar20[4] = -(this[4] == (dwarf)'P');
    auVar20[5] = -(this[5] == (dwarf)'_');
    auVar20[6] = -(this[6] == (dwarf)'d');
    auVar20[7] = -(this[7] == (dwarf)'e');
    auVar20[8] = -(this[8] == (dwarf)'r');
    auVar20[9] = -(this[9] == (dwarf)'e');
    auVar20[10] = -(this[10] == (dwarf)'f');
    auVar20[0xb] = -(this[0xb] == (dwarf)'_');
    auVar20[0xc] = -(this[0xc] == (dwarf)'t');
    auVar20[0xd] = -(this[0xd] == (dwarf)'y');
    auVar20[0xe] = -(this[0xe] == (dwarf)'p');
    auVar20[0xf] = -(this[0xf] == (dwarf)'e');
    bVar7 = (ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar20[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0xa6;
    }
    bVar6 = true;
    if (!bVar7) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0x11) && (!bVar6)) {
    auVar21[0] = -(*this == (dwarf)'D');
    auVar21[1] = -(this[1] == (dwarf)'W');
    auVar21[2] = -(this[2] == (dwarf)'_');
    auVar21[3] = -(this[3] == (dwarf)'O');
    auVar21[4] = -(this[4] == (dwarf)'P');
    auVar21[5] = -(this[5] == (dwarf)'_');
    auVar21[6] = -(this[6] == (dwarf)'x');
    auVar21[7] = -(this[7] == (dwarf)'d');
    auVar21[8] = -(this[8] == (dwarf)'e');
    auVar21[9] = -(this[9] == (dwarf)'r');
    auVar21[10] = -(this[10] == (dwarf)'e');
    auVar21[0xb] = -(this[0xb] == (dwarf)'f');
    auVar21[0xc] = -(this[0xc] == (dwarf)'_');
    auVar21[0xd] = -(this[0xd] == (dwarf)'t');
    auVar21[0xe] = -(this[0xe] == (dwarf)'y');
    auVar21[0xf] = -(this[0xf] == (dwarf)'p');
    auVar42[0] = -(this[0x10] == (dwarf)'e');
    auVar42[1] = 0xff;
    auVar42[2] = 0xff;
    auVar42[3] = 0xff;
    auVar42[4] = 0xff;
    auVar42[5] = 0xff;
    auVar42[6] = 0xff;
    auVar42[7] = 0xff;
    auVar42[8] = 0xff;
    auVar42[9] = 0xff;
    auVar42[10] = 0xff;
    auVar42[0xb] = 0xff;
    auVar42[0xc] = 0xff;
    auVar42[0xd] = 0xff;
    auVar42[0xe] = 0xff;
    auVar42[0xf] = 0xff;
    auVar42 = auVar42 & auVar21;
    bVar7 = (ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0xa7;
    }
    bVar2 = true;
    if (!bVar7) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0xd) && (!bVar2)) {
    if (*(long *)(this + 5) == 0x747265766e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar4 = 0xa8;
    }
    bVar6 = true;
    if (*(long *)(this + 5) != 0x747265766e6f635f || *(long *)this != 0x6f635f504f5f5744) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0x11) && (!bVar6)) {
    auVar22[0] = -(*this == (dwarf)'D');
    auVar22[1] = -(this[1] == (dwarf)'W');
    auVar22[2] = -(this[2] == (dwarf)'_');
    auVar22[3] = -(this[3] == (dwarf)'O');
    auVar22[4] = -(this[4] == (dwarf)'P');
    auVar22[5] = -(this[5] == (dwarf)'_');
    auVar22[6] = -(this[6] == (dwarf)'r');
    auVar22[7] = -(this[7] == (dwarf)'e');
    auVar22[8] = -(this[8] == (dwarf)'i');
    auVar22[9] = -(this[9] == (dwarf)'n');
    auVar22[10] = -(this[10] == (dwarf)'t');
    auVar22[0xb] = -(this[0xb] == (dwarf)'e');
    auVar22[0xc] = -(this[0xc] == (dwarf)'r');
    auVar22[0xd] = -(this[0xd] == (dwarf)'p');
    auVar22[0xe] = -(this[0xe] == (dwarf)'r');
    auVar22[0xf] = -(this[0xf] == (dwarf)'e');
    auVar43[0] = -(this[0x10] == (dwarf)'t');
    auVar43[1] = 0xff;
    auVar43[2] = 0xff;
    auVar43[3] = 0xff;
    auVar43[4] = 0xff;
    auVar43[5] = 0xff;
    auVar43[6] = 0xff;
    auVar43[7] = 0xff;
    auVar43[8] = 0xff;
    auVar43[9] = 0xff;
    auVar43[10] = 0xff;
    auVar43[0xb] = 0xff;
    auVar43[0xc] = 0xff;
    auVar43[0xd] = 0xff;
    auVar43[0xe] = 0xff;
    auVar43[0xf] = 0xff;
    auVar43 = auVar43 & auVar22;
    bVar7 = (ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar43[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0xa9;
    }
    bVar2 = true;
    if (!bVar7) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0x1a) && (!bVar2)) {
    auVar44[0] = -(this[10] == (dwarf)'p');
    auVar44[1] = -(this[0xb] == (dwarf)'u');
    auVar44[2] = -(this[0xc] == (dwarf)'s');
    auVar44[3] = -(this[0xd] == (dwarf)'h');
    auVar44[4] = -(this[0xe] == (dwarf)'_');
    auVar44[5] = -(this[0xf] == (dwarf)'t');
    auVar44[6] = -(this[0x10] == (dwarf)'l');
    auVar44[7] = -(this[0x11] == (dwarf)'s');
    auVar44[8] = -(this[0x12] == (dwarf)'_');
    auVar44[9] = -(this[0x13] == (dwarf)'a');
    auVar44[10] = -(this[0x14] == (dwarf)'d');
    auVar44[0xb] = -(this[0x15] == (dwarf)'d');
    auVar44[0xc] = -(this[0x16] == (dwarf)'r');
    auVar44[0xd] = -(this[0x17] == (dwarf)'e');
    auVar44[0xe] = -(this[0x18] == (dwarf)'s');
    auVar44[0xf] = -(this[0x19] == (dwarf)'s');
    auVar23[0] = -(*this == (dwarf)'D');
    auVar23[1] = -(this[1] == (dwarf)'W');
    auVar23[2] = -(this[2] == (dwarf)'_');
    auVar23[3] = -(this[3] == (dwarf)'O');
    auVar23[4] = -(this[4] == (dwarf)'P');
    auVar23[5] = -(this[5] == (dwarf)'_');
    auVar23[6] = -(this[6] == (dwarf)'G');
    auVar23[7] = -(this[7] == (dwarf)'N');
    auVar23[8] = -(this[8] == (dwarf)'U');
    auVar23[9] = -(this[9] == (dwarf)'_');
    auVar23[10] = -(this[10] == (dwarf)'p');
    auVar23[0xb] = -(this[0xb] == (dwarf)'u');
    auVar23[0xc] = -(this[0xc] == (dwarf)'s');
    auVar23[0xd] = -(this[0xd] == (dwarf)'h');
    auVar23[0xe] = -(this[0xe] == (dwarf)'_');
    auVar23[0xf] = -(this[0xf] == (dwarf)'t');
    auVar23 = auVar23 & auVar44;
    bVar7 = (ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0xe0;
    }
    bVar6 = true;
    if (!bVar7) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0x13) && (!bVar6)) {
    auVar45[0] = -(this[3] == (dwarf)'O');
    auVar45[1] = -(this[4] == (dwarf)'P');
    auVar45[2] = -(this[5] == (dwarf)'_');
    auVar45[3] = -(this[6] == (dwarf)'W');
    auVar45[4] = -(this[7] == (dwarf)'A');
    auVar45[5] = -(this[8] == (dwarf)'S');
    auVar45[6] = -(this[9] == (dwarf)'M');
    auVar45[7] = -(this[10] == (dwarf)'_');
    auVar45[8] = -(this[0xb] == (dwarf)'l');
    auVar45[9] = -(this[0xc] == (dwarf)'o');
    auVar45[10] = -(this[0xd] == (dwarf)'c');
    auVar45[0xb] = -(this[0xe] == (dwarf)'a');
    auVar45[0xc] = -(this[0xf] == (dwarf)'t');
    auVar45[0xd] = -(this[0x10] == (dwarf)'i');
    auVar45[0xe] = -(this[0x11] == (dwarf)'o');
    auVar45[0xf] = -(this[0x12] == (dwarf)'n');
    auVar24[0] = -(*this == (dwarf)'D');
    auVar24[1] = -(this[1] == (dwarf)'W');
    auVar24[2] = -(this[2] == (dwarf)'_');
    auVar24[3] = -(this[3] == (dwarf)'O');
    auVar24[4] = -(this[4] == (dwarf)'P');
    auVar24[5] = -(this[5] == (dwarf)'_');
    auVar24[6] = -(this[6] == (dwarf)'W');
    auVar24[7] = -(this[7] == (dwarf)'A');
    auVar24[8] = -(this[8] == (dwarf)'S');
    auVar24[9] = -(this[9] == (dwarf)'M');
    auVar24[10] = -(this[10] == (dwarf)'_');
    auVar24[0xb] = -(this[0xb] == (dwarf)'l');
    auVar24[0xc] = -(this[0xc] == (dwarf)'o');
    auVar24[0xd] = -(this[0xd] == (dwarf)'c');
    auVar24[0xe] = -(this[0xe] == (dwarf)'a');
    auVar24[0xf] = -(this[0xf] == (dwarf)'t');
    auVar24 = auVar24 & auVar45;
    bVar7 = (ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0xed;
    }
    bVar2 = true;
    if (!bVar7) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0x15) && (!bVar2)) {
    auVar46[0] = -(this[5] == (dwarf)'_');
    auVar46[1] = -(this[6] == (dwarf)'G');
    auVar46[2] = -(this[7] == (dwarf)'N');
    auVar46[3] = -(this[8] == (dwarf)'U');
    auVar46[4] = -(this[9] == (dwarf)'_');
    auVar46[5] = -(this[10] == (dwarf)'e');
    auVar46[6] = -(this[0xb] == (dwarf)'n');
    auVar46[7] = -(this[0xc] == (dwarf)'t');
    auVar46[8] = -(this[0xd] == (dwarf)'r');
    auVar46[9] = -(this[0xe] == (dwarf)'y');
    auVar46[10] = -(this[0xf] == (dwarf)'_');
    auVar46[0xb] = -(this[0x10] == (dwarf)'v');
    auVar46[0xc] = -(this[0x11] == (dwarf)'a');
    auVar46[0xd] = -(this[0x12] == (dwarf)'l');
    auVar46[0xe] = -(this[0x13] == (dwarf)'u');
    auVar46[0xf] = -(this[0x14] == (dwarf)'e');
    auVar25[0] = -(*this == (dwarf)'D');
    auVar25[1] = -(this[1] == (dwarf)'W');
    auVar25[2] = -(this[2] == (dwarf)'_');
    auVar25[3] = -(this[3] == (dwarf)'O');
    auVar25[4] = -(this[4] == (dwarf)'P');
    auVar25[5] = -(this[5] == (dwarf)'_');
    auVar25[6] = -(this[6] == (dwarf)'G');
    auVar25[7] = -(this[7] == (dwarf)'N');
    auVar25[8] = -(this[8] == (dwarf)'U');
    auVar25[9] = -(this[9] == (dwarf)'_');
    auVar25[10] = -(this[10] == (dwarf)'e');
    auVar25[0xb] = -(this[0xb] == (dwarf)'n');
    auVar25[0xc] = -(this[0xc] == (dwarf)'t');
    auVar25[0xd] = -(this[0xd] == (dwarf)'r');
    auVar25[0xe] = -(this[0xe] == (dwarf)'y');
    auVar25[0xf] = -(this[0xf] == (dwarf)'_');
    auVar25 = auVar25 & auVar46;
    bVar7 = (ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0xf3;
    }
    bVar6 = true;
    if (!bVar7) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0x14) && (!bVar6)) {
    uVar1 = *(undefined4 *)(this + 0x10);
    auVar47[0] = -((char)uVar1 == 'n');
    auVar47[1] = -((char)((uint)uVar1 >> 8) == 'd');
    auVar47[2] = -((char)((uint)uVar1 >> 0x10) == 'e');
    auVar47[3] = -((char)((uint)uVar1 >> 0x18) == 'x');
    auVar47[4] = 0xff;
    auVar47[5] = 0xff;
    auVar47[6] = 0xff;
    auVar47[7] = 0xff;
    auVar47[8] = 0xff;
    auVar47[9] = 0xff;
    auVar47[10] = 0xff;
    auVar47[0xb] = 0xff;
    auVar47[0xc] = 0xff;
    auVar47[0xd] = 0xff;
    auVar47[0xe] = 0xff;
    auVar47[0xf] = 0xff;
    auVar26[0] = -(*this == (dwarf)'D');
    auVar26[1] = -(this[1] == (dwarf)'W');
    auVar26[2] = -(this[2] == (dwarf)'_');
    auVar26[3] = -(this[3] == (dwarf)'O');
    auVar26[4] = -(this[4] == (dwarf)'P');
    auVar26[5] = -(this[5] == (dwarf)'_');
    auVar26[6] = -(this[6] == (dwarf)'G');
    auVar26[7] = -(this[7] == (dwarf)'N');
    auVar26[8] = -(this[8] == (dwarf)'U');
    auVar26[9] = -(this[9] == (dwarf)'_');
    auVar26[10] = -(this[10] == (dwarf)'a');
    auVar26[0xb] = -(this[0xb] == (dwarf)'d');
    auVar26[0xc] = -(this[0xc] == (dwarf)'d');
    auVar26[0xd] = -(this[0xd] == (dwarf)'r');
    auVar26[0xe] = -(this[0xe] == (dwarf)'_');
    auVar26[0xf] = -(this[0xf] == (dwarf)'i');
    auVar26 = auVar26 & auVar47;
    bVar7 = (ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0xfb;
    }
    bVar2 = true;
    if (!bVar7) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0x15) && (!bVar2)) {
    auVar48[0] = -(this[5] == (dwarf)'_');
    auVar48[1] = -(this[6] == (dwarf)'G');
    auVar48[2] = -(this[7] == (dwarf)'N');
    auVar48[3] = -(this[8] == (dwarf)'U');
    auVar48[4] = -(this[9] == (dwarf)'_');
    auVar48[5] = -(this[10] == (dwarf)'c');
    auVar48[6] = -(this[0xb] == (dwarf)'o');
    auVar48[7] = -(this[0xc] == (dwarf)'n');
    auVar48[8] = -(this[0xd] == (dwarf)'s');
    auVar48[9] = -(this[0xe] == (dwarf)'t');
    auVar48[10] = -(this[0xf] == (dwarf)'_');
    auVar48[0xb] = -(this[0x10] == (dwarf)'i');
    auVar48[0xc] = -(this[0x11] == (dwarf)'n');
    auVar48[0xd] = -(this[0x12] == (dwarf)'d');
    auVar48[0xe] = -(this[0x13] == (dwarf)'e');
    auVar48[0xf] = -(this[0x14] == (dwarf)'x');
    auVar27[0] = -(*this == (dwarf)'D');
    auVar27[1] = -(this[1] == (dwarf)'W');
    auVar27[2] = -(this[2] == (dwarf)'_');
    auVar27[3] = -(this[3] == (dwarf)'O');
    auVar27[4] = -(this[4] == (dwarf)'P');
    auVar27[5] = -(this[5] == (dwarf)'_');
    auVar27[6] = -(this[6] == (dwarf)'G');
    auVar27[7] = -(this[7] == (dwarf)'N');
    auVar27[8] = -(this[8] == (dwarf)'U');
    auVar27[9] = -(this[9] == (dwarf)'_');
    auVar27[10] = -(this[10] == (dwarf)'c');
    auVar27[0xb] = -(this[0xb] == (dwarf)'o');
    auVar27[0xc] = -(this[0xc] == (dwarf)'n');
    auVar27[0xd] = -(this[0xd] == (dwarf)'s');
    auVar27[0xe] = -(this[0xe] == (dwarf)'t');
    auVar27[0xf] = -(this[0xf] == (dwarf)'_');
    auVar27 = auVar27 & auVar48;
    bVar7 = (ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0xfc;
    }
    bVar6 = true;
    if (!bVar7) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0x12) && (!bVar6)) {
    auVar28[0] = -(*this == (dwarf)'D');
    auVar28[1] = -(this[1] == (dwarf)'W');
    auVar28[2] = -(this[2] == (dwarf)'_');
    auVar28[3] = -(this[3] == (dwarf)'O');
    auVar28[4] = -(this[4] == (dwarf)'P');
    auVar28[5] = -(this[5] == (dwarf)'_');
    auVar28[6] = -(this[6] == (dwarf)'L');
    auVar28[7] = -(this[7] == (dwarf)'L');
    auVar28[8] = -(this[8] == (dwarf)'V');
    auVar28[9] = -(this[9] == (dwarf)'M');
    auVar28[10] = -(this[10] == (dwarf)'_');
    auVar28[0xb] = -(this[0xb] == (dwarf)'c');
    auVar28[0xc] = -(this[0xc] == (dwarf)'o');
    auVar28[0xd] = -(this[0xd] == (dwarf)'n');
    auVar28[0xe] = -(this[0xe] == (dwarf)'v');
    auVar28[0xf] = -(this[0xf] == (dwarf)'e');
    auVar49[0] = -((char)*(undefined2 *)(this + 0x10) == 'r');
    auVar49[1] = -((char)((ushort)*(undefined2 *)(this + 0x10) >> 8) == 't');
    auVar49[2] = 0xff;
    auVar49[3] = 0xff;
    auVar49[4] = 0xff;
    auVar49[5] = 0xff;
    auVar49[6] = 0xff;
    auVar49[7] = 0xff;
    auVar49[8] = 0xff;
    auVar49[9] = 0xff;
    auVar49[10] = 0xff;
    auVar49[0xb] = 0xff;
    auVar49[0xc] = 0xff;
    auVar49[0xd] = 0xff;
    auVar49[0xe] = 0xff;
    auVar49[0xf] = 0xff;
    auVar49 = auVar49 & auVar28;
    bVar7 = (ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar49[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0x1001;
    }
    bVar2 = true;
    if (!bVar7) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0x13) && (!bVar2)) {
    auVar50[0] = -(this[3] == (dwarf)'O');
    auVar50[1] = -(this[4] == (dwarf)'P');
    auVar50[2] = -(this[5] == (dwarf)'_');
    auVar50[3] = -(this[6] == (dwarf)'L');
    auVar50[4] = -(this[7] == (dwarf)'L');
    auVar50[5] = -(this[8] == (dwarf)'V');
    auVar50[6] = -(this[9] == (dwarf)'M');
    auVar50[7] = -(this[10] == (dwarf)'_');
    auVar50[8] = -(this[0xb] == (dwarf)'f');
    auVar50[9] = -(this[0xc] == (dwarf)'r');
    auVar50[10] = -(this[0xd] == (dwarf)'a');
    auVar50[0xb] = -(this[0xe] == (dwarf)'g');
    auVar50[0xc] = -(this[0xf] == (dwarf)'m');
    auVar50[0xd] = -(this[0x10] == (dwarf)'e');
    auVar50[0xe] = -(this[0x11] == (dwarf)'n');
    auVar50[0xf] = -(this[0x12] == (dwarf)'t');
    auVar29[0] = -(*this == (dwarf)'D');
    auVar29[1] = -(this[1] == (dwarf)'W');
    auVar29[2] = -(this[2] == (dwarf)'_');
    auVar29[3] = -(this[3] == (dwarf)'O');
    auVar29[4] = -(this[4] == (dwarf)'P');
    auVar29[5] = -(this[5] == (dwarf)'_');
    auVar29[6] = -(this[6] == (dwarf)'L');
    auVar29[7] = -(this[7] == (dwarf)'L');
    auVar29[8] = -(this[8] == (dwarf)'V');
    auVar29[9] = -(this[9] == (dwarf)'M');
    auVar29[10] = -(this[10] == (dwarf)'_');
    auVar29[0xb] = -(this[0xb] == (dwarf)'f');
    auVar29[0xc] = -(this[0xc] == (dwarf)'r');
    auVar29[0xd] = -(this[0xd] == (dwarf)'a');
    auVar29[0xe] = -(this[0xe] == (dwarf)'g');
    auVar29[0xf] = -(this[0xf] == (dwarf)'m');
    auVar29 = auVar29 & auVar50;
    bVar7 = (ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0x1000;
    }
    bVar6 = true;
    if (!bVar7) {
      bVar6 = bVar2;
    }
  }
  bVar2 = bVar6;
  if ((pcVar5 == (char *)0x15) && (!bVar6)) {
    auVar51[0] = -(this[5] == (dwarf)'_');
    auVar51[1] = -(this[6] == (dwarf)'L');
    auVar51[2] = -(this[7] == (dwarf)'L');
    auVar51[3] = -(this[8] == (dwarf)'V');
    auVar51[4] = -(this[9] == (dwarf)'M');
    auVar51[5] = -(this[10] == (dwarf)'_');
    auVar51[6] = -(this[0xb] == (dwarf)'t');
    auVar51[7] = -(this[0xc] == (dwarf)'a');
    auVar51[8] = -(this[0xd] == (dwarf)'g');
    auVar51[9] = -(this[0xe] == (dwarf)'_');
    auVar51[10] = -(this[0xf] == (dwarf)'o');
    auVar51[0xb] = -(this[0x10] == (dwarf)'f');
    auVar51[0xc] = -(this[0x11] == (dwarf)'f');
    auVar51[0xd] = -(this[0x12] == (dwarf)'s');
    auVar51[0xe] = -(this[0x13] == (dwarf)'e');
    auVar51[0xf] = -(this[0x14] == (dwarf)'t');
    auVar30[0] = -(*this == (dwarf)'D');
    auVar30[1] = -(this[1] == (dwarf)'W');
    auVar30[2] = -(this[2] == (dwarf)'_');
    auVar30[3] = -(this[3] == (dwarf)'O');
    auVar30[4] = -(this[4] == (dwarf)'P');
    auVar30[5] = -(this[5] == (dwarf)'_');
    auVar30[6] = -(this[6] == (dwarf)'L');
    auVar30[7] = -(this[7] == (dwarf)'L');
    auVar30[8] = -(this[8] == (dwarf)'V');
    auVar30[9] = -(this[9] == (dwarf)'M');
    auVar30[10] = -(this[10] == (dwarf)'_');
    auVar30[0xb] = -(this[0xb] == (dwarf)'t');
    auVar30[0xc] = -(this[0xc] == (dwarf)'a');
    auVar30[0xd] = -(this[0xd] == (dwarf)'g');
    auVar30[0xe] = -(this[0xe] == (dwarf)'_');
    auVar30[0xf] = -(this[0xf] == (dwarf)'o');
    auVar30 = auVar30 & auVar51;
    bVar7 = (ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0x1002;
    }
    bVar2 = true;
    if (!bVar7) {
      bVar2 = bVar6;
    }
  }
  bVar6 = bVar2;
  if ((pcVar5 == (char *)0x16) && (!bVar2)) {
    auVar52[0] = -(this[6] == (dwarf)'L');
    auVar52[1] = -(this[7] == (dwarf)'L');
    auVar52[2] = -(this[8] == (dwarf)'V');
    auVar52[3] = -(this[9] == (dwarf)'M');
    auVar52[4] = -(this[10] == (dwarf)'_');
    auVar52[5] = -(this[0xb] == (dwarf)'e');
    auVar52[6] = -(this[0xc] == (dwarf)'n');
    auVar52[7] = -(this[0xd] == (dwarf)'t');
    auVar52[8] = -(this[0xe] == (dwarf)'r');
    auVar52[9] = -(this[0xf] == (dwarf)'y');
    auVar52[10] = -(this[0x10] == (dwarf)'_');
    auVar52[0xb] = -(this[0x11] == (dwarf)'v');
    auVar52[0xc] = -(this[0x12] == (dwarf)'a');
    auVar52[0xd] = -(this[0x13] == (dwarf)'l');
    auVar52[0xe] = -(this[0x14] == (dwarf)'u');
    auVar52[0xf] = -(this[0x15] == (dwarf)'e');
    auVar31[0] = -(*this == (dwarf)'D');
    auVar31[1] = -(this[1] == (dwarf)'W');
    auVar31[2] = -(this[2] == (dwarf)'_');
    auVar31[3] = -(this[3] == (dwarf)'O');
    auVar31[4] = -(this[4] == (dwarf)'P');
    auVar31[5] = -(this[5] == (dwarf)'_');
    auVar31[6] = -(this[6] == (dwarf)'L');
    auVar31[7] = -(this[7] == (dwarf)'L');
    auVar31[8] = -(this[8] == (dwarf)'V');
    auVar31[9] = -(this[9] == (dwarf)'M');
    auVar31[10] = -(this[10] == (dwarf)'_');
    auVar31[0xb] = -(this[0xb] == (dwarf)'e');
    auVar31[0xc] = -(this[0xc] == (dwarf)'n');
    auVar31[0xd] = -(this[0xd] == (dwarf)'t');
    auVar31[0xe] = -(this[0xe] == (dwarf)'r');
    auVar31[0xf] = -(this[0xf] == (dwarf)'y');
    auVar31 = auVar31 & auVar52;
    bVar7 = (ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar7) {
      uVar4 = 0x1003;
    }
    bVar6 = true;
    if (!bVar7) {
      bVar6 = bVar2;
    }
  }
  uVar3 = 0;
  if (bVar6) {
    uVar3 = uVar4;
  }
  return uVar3;
}

Assistant:

unsigned llvm::dwarf::getOperationEncoding(StringRef OperationEncodingString) {
  return StringSwitch<unsigned>(OperationEncodingString)
#define HANDLE_DW_OP(ID, NAME, VERSION, VENDOR)                                \
  .Case("DW_OP_" #NAME, DW_OP_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Case("DW_OP_LLVM_convert", DW_OP_LLVM_convert)
      .Case("DW_OP_LLVM_fragment", DW_OP_LLVM_fragment)
      .Case("DW_OP_LLVM_tag_offset", DW_OP_LLVM_tag_offset)
      .Case("DW_OP_LLVM_entry_value", DW_OP_LLVM_entry_value)
      .Default(0);
}